

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,basic_string_view<char> s,format_specs *specs)

{
  anon_class_24_3_b33ccaaf_for_f f;
  buffer<char> *pbVar1;
  basic_appender<char> bVar2;
  format_specs *specs_00;
  count_code_points f_00;
  uint uVar3;
  basic_string_view<char> str;
  string_view s_00;
  string_view s_01;
  size_t result;
  counting_buffer<char> buf;
  buffer<char> *local_168;
  buffer<char> *local_160;
  undefined1 local_158 [288];
  long local_38;
  
  specs_00 = (format_specs *)s.size_;
  str.data_ = (buffer<char> *)s.data_;
  pbVar1 = (buffer<char> *)(long)specs_00->precision;
  f_00.count = (size_t *)specs_00;
  local_158._32_8_ = str.data_;
  if ((-1 < (long)pbVar1) && (pbVar1 < str.data_)) {
    f_00.count = (size_t *)&local_160;
    local_158._16_8_ = &local_168;
    f.n = f_00.count;
    f.begin = (char *)out.container;
    f.result = (size_t *)local_158._16_8_;
    s_00.size_ = (size_t)str.data_;
    s_00.data_ = (char *)out.container;
    local_168 = str.data_;
    local_160 = pbVar1;
    local_158._0_8_ = out.container;
    local_158._8_8_ = f_00.count;
    for_each_codepoint<fmt::v11::detail::code_point_index(fmt::v11::basic_string_view<char>,unsigned_long)::_lambda(unsigned_int,fmt::v11::basic_string_view<char>)_1_>
              (s_00,f);
    local_158._32_8_ = local_168;
  }
  uVar3 = (specs_00->super_basic_specs).data_ & 7;
  if (uVar3 == 1) {
    local_158._0_8_ = local_158 + 0x20;
    local_158._8_8_ = (char *)0x0;
    local_158._16_8_ = 0x100;
    local_158._24_8_ = counting_buffer<char>::grow;
    local_38 = 0;
    str.size_ = (size_t)counting_buffer<char>::grow;
    write_escaped_string<char,fmt::v11::basic_appender<char>>((detail *)local_158,out,str);
    local_158._32_8_ = local_158._8_8_ + local_38;
    pbVar1 = (buffer<char> *)0x0;
    if (specs_00->width != 0) {
      pbVar1 = (buffer<char> *)local_158._32_8_;
    }
  }
  else if (specs_00->width == 0) {
    pbVar1 = (buffer<char> *)0x0;
  }
  else {
    local_158._0_8_ = (buffer<char> *)0x0;
    s_01.size_ = (size_t)local_158;
    s_01.data_ = (char *)local_158._32_8_;
    for_each_codepoint<fmt::v11::detail::compute_width(fmt::v11::basic_string_view<char>)::count_code_points>
              ((detail *)out.container,s_01,f_00);
    pbVar1 = (buffer<char> *)local_158._0_8_;
  }
  local_158[0] = uVar3 == 1;
  local_158._8_8_ = out.container;
  local_158._16_8_ = str.data_;
  local_158._24_8_ = out.container;
  bVar2 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,specs_00,local_158._32_8_,pbVar1,
                     (anon_class_40_4_6b3cdfe0 *)local_158);
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));

  bool is_debug = specs.type() == presentation_type::debug;
  if (is_debug) {
    auto buf = counting_buffer<Char>();
    write_escaped_string(basic_appender<Char>(buf), s);
    size = buf.count();
  }

  size_t width = 0;
  if (specs.width != 0) {
    width =
        is_debug ? size : compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded<Char>(
      out, specs, size, width, [=](reserve_iterator<OutputIt> it) {
        return is_debug ? write_escaped_string(it, s)
                        : copy<Char>(data, data + size, it);
      });
}